

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis_enc.c
# Opt level: O0

int VP8EncAnalyze(VP8Encoder *enc)

{
  uint uVar1;
  long *in_RDI;
  SegmentJob side_job;
  SegmentJob main_job;
  WebPWorkerInterface *worker_interface;
  int do_mt;
  int kMinSplitRow;
  int total_mb;
  int split_row;
  int last_row;
  int do_segments;
  int ok;
  undefined6 in_stack_ffffffffffffd938;
  undefined1 uVar2;
  undefined1 uVar3;
  VP8Encoder *in_stack_ffffffffffffd940;
  int *in_stack_ffffffffffffddc8;
  VP8Encoder *in_stack_ffffffffffffddd0;
  SegmentJob local_1378;
  WebPWorkerInterface *local_30;
  uint local_24;
  undefined4 local_20;
  int local_1c;
  int local_18;
  int local_14;
  uint local_10;
  uint local_c;
  long *local_8;
  
  local_c = 1;
  uVar3 = true;
  if ((*(int *)(*in_RDI + 0x50) == 0) && (uVar3 = true, (int)in_RDI[4] < 2)) {
    uVar3 = (int)in_RDI[0xb88] < 2;
  }
  local_10 = (uint)(byte)uVar3;
  if (local_10 == 0) {
    ResetAllMBInfo(in_stack_ffffffffffffd940);
  }
  else {
    local_14 = *(int *)((long)in_RDI + 0x34);
    local_18 = local_14 * 9 + 0xf >> 4;
    local_1c = local_14 * (int)in_RDI[6];
    local_20 = 2;
    uVar2 = 0 < (int)in_RDI[0xb8a] && 1 < local_18;
    local_24 = (uint)(byte)uVar2;
    local_8 = in_RDI;
    local_30 = WebPGetWorkerInterface();
    if (local_24 == 0) {
      InitSegmentJob(in_stack_ffffffffffffd940,
                     (SegmentJob *)CONCAT17(uVar3,CONCAT16(uVar2,in_stack_ffffffffffffd938)),0,
                     0x164aec);
      (*local_30->Execute)(&local_1378.worker);
      uVar1 = (*local_30->Sync)(&local_1378.worker);
      local_c = uVar1 & local_c;
    }
    else {
      InitSegmentJob(in_stack_ffffffffffffd940,
                     (SegmentJob *)CONCAT17(uVar3,CONCAT16(uVar2,in_stack_ffffffffffffd938)),0,
                     0x1649e4);
      InitSegmentJob(in_stack_ffffffffffffd940,
                     (SegmentJob *)CONCAT17(uVar3,CONCAT16(uVar2,in_stack_ffffffffffffd938)),0,
                     0x164a04);
      uVar1 = (*local_30->Reset)((WebPWorker *)&stack0xffffffffffffd940);
      local_c = uVar1 & local_c;
      if (local_c != 0) {
        (*local_30->Launch)((WebPWorker *)&stack0xffffffffffffd940);
        (*local_30->Execute)(&local_1378.worker);
        uVar1 = (*local_30->Sync)((WebPWorker *)&stack0xffffffffffffd940);
        local_c = uVar1 & local_c;
        uVar1 = (*local_30->Sync)(&local_1378.worker);
        local_c = uVar1 & local_c;
      }
      (*local_30->End)((WebPWorker *)&stack0xffffffffffffd940);
      if (local_c != 0) {
        MergeJobs((SegmentJob *)&stack0xffffffffffffd940,&local_1378);
      }
    }
    (*local_30->End)(&local_1378.worker);
    if (local_c != 0) {
      *(int *)((long)local_8 + 0xe04) = local_1378.alpha / local_1c;
      *(int *)(local_8 + 0x1c1) = local_1378.uv_alpha / local_1c;
      AssignSegments(in_stack_ffffffffffffddd0,in_stack_ffffffffffffddc8);
    }
  }
  return local_c;
}

Assistant:

int VP8EncAnalyze(VP8Encoder* const enc) {
  int ok = 1;
  const int do_segments =
      enc->config_->emulate_jpeg_size ||   // We need the complexity evaluation.
      (enc->segment_hdr_.num_segments_ > 1) ||
      (enc->method_ <= 1);  // for method 0 - 1, we need preds_[] to be filled.
  if (do_segments) {
    const int last_row = enc->mb_h_;
    // We give a little more than a half work to the main thread.
    const int split_row = (9 * last_row + 15) >> 4;
    const int total_mb = last_row * enc->mb_w_;
#ifdef WEBP_USE_THREAD
    const int kMinSplitRow = 2;  // minimal rows needed for mt to be worth it
    const int do_mt = (enc->thread_level_ > 0) && (split_row >= kMinSplitRow);
#else
    const int do_mt = 0;
#endif
    const WebPWorkerInterface* const worker_interface =
        WebPGetWorkerInterface();
    SegmentJob main_job;
    if (do_mt) {
      SegmentJob side_job;
      // Note the use of '&' instead of '&&' because we must call the functions
      // no matter what.
      InitSegmentJob(enc, &main_job, 0, split_row);
      InitSegmentJob(enc, &side_job, split_row, last_row);
      // we don't need to call Reset() on main_job.worker, since we're calling
      // WebPWorkerExecute() on it
      ok &= worker_interface->Reset(&side_job.worker);
      // launch the two jobs in parallel
      if (ok) {
        worker_interface->Launch(&side_job.worker);
        worker_interface->Execute(&main_job.worker);
        ok &= worker_interface->Sync(&side_job.worker);
        ok &= worker_interface->Sync(&main_job.worker);
      }
      worker_interface->End(&side_job.worker);
      if (ok) MergeJobs(&side_job, &main_job);  // merge results together
    } else {
      // Even for single-thread case, we use the generic Worker tools.
      InitSegmentJob(enc, &main_job, 0, last_row);
      worker_interface->Execute(&main_job.worker);
      ok &= worker_interface->Sync(&main_job.worker);
    }
    worker_interface->End(&main_job.worker);
    if (ok) {
      enc->alpha_ = main_job.alpha / total_mb;
      enc->uv_alpha_ = main_job.uv_alpha / total_mb;
      AssignSegments(enc, main_job.alphas);
    }
  } else {   // Use only one default segment.
    ResetAllMBInfo(enc);
  }
  return ok;
}